

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::UniformBlocksLayoutBindingCase::buildBlock
          (String *__return_storage_ptr__,UniformBlocksLayoutBindingCase *this,String *name,
          String *type)

{
  ostream *poVar1;
  undefined1 local_1a0 [8];
  ostringstream s;
  String *type_local;
  String *name_local;
  UniformBlocksLayoutBindingCase *this_local;
  
  s._368_8_ = type;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,"{");
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)s._368_8_);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"_a; ");
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)s._368_8_);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"_b; ");
  std::operator<<((ostream *)local_1a0,"}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

String buildBlock(const String& name, const String& type)
	{

		std::ostringstream s;
		s << "{";
		s << type << " " << name << "_a; ";
		s << type << " " << name << "_b; ";
		s << "}";
		return s.str();
	}